

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O3

size_t pstore::utf::length(czstring str)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (str == (czstring)0x0) {
    return 0;
  }
  sVar1 = strlen(str);
  if (sVar1 == 0) {
    sVar2 = 0;
  }
  else {
    sVar3 = 0;
    sVar2 = 0;
    do {
      sVar2 = sVar2 + 1;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return sVar2;
}

Assistant:

auto length (gsl::czstring const str) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + std::strlen (str));
        }